

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_sse.c
# Opt level: O1

parasail_profile_t *
parasail_profile_create_sse_128_8(char *s1,int _s1Len,parasail_matrix_t *matrix)

{
  undefined8 *puVar1;
  uint uVar2;
  void *pvVar3;
  parasail_profile_t *ppVar4;
  ulong uVar5;
  uint uVar6;
  byte *pbVar8;
  undefined1 uVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  __m128i_8_t t;
  undefined8 local_48;
  undefined8 uStack_40;
  int iVar7;
  
  if (matrix == (parasail_matrix_t *)0x0) {
    parasail_profile_create_sse_128_8_cold_2();
  }
  else if (s1 == (char *)0x0 && matrix->type == 0) {
    parasail_profile_create_sse_128_8_cold_1();
  }
  else {
    if (matrix->type != 0) {
      _s1Len = matrix->length;
    }
    uVar2 = matrix->size;
    iVar7 = _s1Len + 0x1e;
    if (-1 < _s1Len + 0xf) {
      iVar7 = _s1Len + 0xf;
    }
    uVar6 = iVar7 >> 4;
    pvVar3 = parasail_memalign(0x10,(long)(int)(uVar6 * uVar2) << 4);
    if ((pvVar3 != (void *)0x0) &&
       (ppVar4 = parasail_profile_new(s1,_s1Len,matrix), ppVar4 != (parasail_profile_t *)0x0)) {
      if (0 < (int)uVar2) {
        uVar5 = 1;
        if (1 < (int)uVar6) {
          uVar5 = (ulong)uVar6;
        }
        uVar15 = 0;
        lVar11 = 0;
        do {
          if (0 < _s1Len) {
            lVar11 = (long)(int)lVar11;
            uVar12 = 0;
            do {
              iVar7 = matrix->type;
              lVar14 = 0;
              uVar13 = uVar12;
              do {
                if (iVar7 == 0) {
                  if ((int)uVar13 < _s1Len) {
                    pbVar8 = (byte *)(s1 + uVar13);
                    uVar10 = uVar15;
                    goto LAB_0059f4ad;
                  }
LAB_0059f4cd:
                  uVar9 = 0;
                }
                else {
                  if (_s1Len <= (int)uVar13) goto LAB_0059f4cd;
                  pbVar8 = (byte *)(matrix->alphabet + uVar15);
                  uVar10 = uVar13;
LAB_0059f4ad:
                  uVar9 = (undefined1)
                          matrix->matrix
                          [(long)(int)((int)uVar10 * uVar2) + (long)matrix->mapper[*pbVar8]];
                }
                *(undefined1 *)((long)&local_48 + lVar14) = uVar9;
                uVar13 = uVar13 + uVar6;
                lVar14 = lVar14 + 1;
              } while (lVar14 != 0x10);
              puVar1 = (undefined8 *)((long)pvVar3 + lVar11 * 0x10);
              *puVar1 = local_48;
              puVar1[1] = uStack_40;
              lVar11 = lVar11 + 1;
              uVar12 = uVar12 + 1;
            } while (uVar12 != uVar5);
          }
          uVar15 = uVar15 + 1;
        } while (uVar15 != uVar2);
      }
      (ppVar4->profile8).score = pvVar3;
      ppVar4->free = parasail_free___m128i;
      return ppVar4;
    }
  }
  return (parasail_profile_t *)0x0;
}

Assistant:

parasail_profile_t * parasail_profile_create_sse_128_8(
        const char * const restrict s1, const int _s1Len,
        const parasail_matrix_t *matrix)
{
    int s1Len = 0;
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t segNum = 0;
    int32_t n = 0; /* number of amino acids in table */
    const int32_t segWidth = 16; /* number of values in vector unit */
    int32_t segLen = 0;
    __m128i* restrict vProfile = NULL;
    int32_t index = 0;
    parasail_profile_t *profile = NULL;

    PARASAIL_CHECK_NULL(matrix);
    /* s1 is ignored for pssm, required for square */
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        PARASAIL_CHECK_NULL(s1);
    }

    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    n = matrix->size;
    segLen = (s1Len + segWidth - 1) / segWidth;
    vProfile = parasail_memalign___m128i(16, n * segLen);
    if (!vProfile) return NULL;
    profile = parasail_profile_new(s1, s1Len, matrix);
    if (!profile) return NULL;

    for (k=0; k<n; ++k) {
        for (i=0; i<segLen; ++i) {
            __m128i_8_t t;
            j = i;
            for (segNum=0; segNum<segWidth; ++segNum) {
                if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
                    t.v[segNum] = j >= s1Len ? 0 : matrix->matrix[n*k+matrix->mapper[(unsigned char)s1[j]]];
                }
                else {
                    t.v[segNum] = j >= s1Len ? 0 : matrix->matrix[n*j+matrix->mapper[(unsigned char)matrix->alphabet[k]]];
                }
                j += segLen;
            }
            _mm_store_si128(&vProfile[index], t.m);
            ++index;
        }
    }

    profile->profile8.score = vProfile;
    profile->free = &parasail_free___m128i;
    return profile;
}